

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::MutableMessage
          (ExtensionSet *this,int number,FieldType type,MessageLite *prototype,
          FieldDescriptor *descriptor)

{
  byte bVar1;
  int iVar2;
  Extension *pEVar3;
  MessageLite *pMVar4;
  undefined4 extraout_var;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar5;
  
  pVar5 = Insert(this,number);
  pEVar3 = pVar5.first;
  pEVar3->descriptor = descriptor;
  if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar3->is_repeated != false) goto LAB_0023bdfe;
    if (0xed < (byte)(pEVar3->type - 0x13)) {
      if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar3->type * 4) == 10) {
        bVar1 = pEVar3->field_0xa;
        pEVar3->field_0xa = bVar1 & 0xfd;
        pMVar4 = (MessageLite *)(pEVar3->field_0).int64_t_value;
        if ((bVar1 & 4) == 0) {
          return pMVar4;
        }
        iVar2 = (*pMVar4->_vptr_MessageLite[5])
                          (pMVar4,prototype,this->arena_,pMVar4->_vptr_MessageLite[5]);
        return (MessageLite *)CONCAT44(extraout_var,iVar2);
      }
      goto LAB_0023be16;
    }
  }
  else {
    pEVar3->type = type;
    if ((byte)(type - 0x13) < 0xee) {
      MutableMessage((ExtensionSet *)&stack0xffffffffffffffc8);
LAB_0023bdfe:
      MutableMessage((ExtensionSet *)&stack0xffffffffffffffc8);
    }
    else if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4) == 10) {
      pEVar3->is_repeated = false;
      pEVar3->field_0xa = (pEVar3->field_0xa & 0xfa) + 1;
      pMVar4 = MessageLite::New(prototype,this->arena_);
      (pEVar3->field_0).int64_t_value = (int64_t)pMVar4;
      pEVar3->field_0xa = pEVar3->field_0xa & 0xfd;
      return pMVar4;
    }
    MutableMessage();
  }
  MutableMessage((ExtensionSet *)&stack0xffffffffffffffc8);
LAB_0023be16:
  MutableMessage();
}

Assistant:

MessageLite* ExtensionSet::MutableMessage(int number, FieldType type,
                                          const MessageLite& prototype,
                                          const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_pointer = true;
    extension->is_lazy = false;
    extension->ptr.message_value = prototype.New(arena_);
    extension->is_cleared = false;
    return extension->ptr.message_value;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    extension->is_cleared = false;
    if (extension->is_lazy) {
      return extension->ptr.lazymessage_value->MutableMessage(prototype,
                                                              arena_);
    } else {
      return extension->ptr.message_value;
    }
  }
}